

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigPartReg.c
# Opt level: O1

Aig_ManPre_t * Aig_ManRegManStart(Aig_Man_t *pAig,int nPartSize)

{
  Aig_ManPre_t *pAVar1;
  Vec_Ptr_t *pVVar2;
  void **ppvVar3;
  Vec_Int_t *pVVar4;
  int *piVar5;
  Vec_Flt_t *pVVar6;
  float *pfVar7;
  char *pcVar8;
  size_t __size;
  
  pAVar1 = (Aig_ManPre_t *)malloc(0x50);
  pAVar1->pAig = (Aig_Man_t *)0x0;
  pAVar1->vMatrix = (Vec_Ptr_t *)0x0;
  *(undefined8 *)&pAVar1->nRegsMax = 0;
  pAVar1->vParts = (Vec_Ptr_t *)0x0;
  pAVar1->pfUsedRegs = (char *)0x0;
  pAVar1->vRegs = (Vec_Int_t *)0x0;
  pAVar1->vUniques = (Vec_Int_t *)0x0;
  pAVar1->vFreeVars = (Vec_Int_t *)0x0;
  pAVar1->vPartCost = (Vec_Flt_t *)0x0;
  pAVar1->pfPartVars = (char *)0x0;
  pAVar1->pAig = pAig;
  pVVar2 = Aig_ManSupportsRegisters(pAig);
  pAVar1->vMatrix = pVVar2;
  pAVar1->nRegsMax = nPartSize;
  pVVar2 = (Vec_Ptr_t *)malloc(0x10);
  pVVar2->nCap = 0x100;
  pVVar2->nSize = 0;
  ppvVar3 = (void **)malloc(0x800);
  pVVar2->pArray = ppvVar3;
  pAVar1->vParts = pVVar2;
  pVVar4 = (Vec_Int_t *)malloc(0x10);
  pVVar4->nCap = 0x100;
  pVVar4->nSize = 0;
  piVar5 = (int *)malloc(0x400);
  pVVar4->pArray = piVar5;
  pAVar1->vRegs = pVVar4;
  pVVar4 = (Vec_Int_t *)malloc(0x10);
  pVVar4->nCap = 0x100;
  pVVar4->nSize = 0;
  piVar5 = (int *)malloc(0x400);
  pVVar4->pArray = piVar5;
  pAVar1->vUniques = pVVar4;
  pVVar4 = (Vec_Int_t *)malloc(0x10);
  pVVar4->nCap = 0x100;
  pVVar4->nSize = 0;
  piVar5 = (int *)malloc(0x400);
  pVVar4->pArray = piVar5;
  pAVar1->vFreeVars = pVVar4;
  pVVar6 = (Vec_Flt_t *)malloc(0x10);
  pVVar6->nCap = 0x100;
  pVVar6->nSize = 0;
  pfVar7 = (float *)malloc(0x400);
  pVVar6->pArray = pfVar7;
  pAVar1->vPartCost = pVVar6;
  __size = (size_t)pAig->nRegs;
  pcVar8 = (char *)malloc(__size);
  pAVar1->pfUsedRegs = pcVar8;
  memset(pcVar8,0,__size);
  pcVar8 = (char *)malloc(__size);
  pAVar1->pfPartVars = pcVar8;
  return pAVar1;
}

Assistant:

Aig_ManPre_t * Aig_ManRegManStart( Aig_Man_t * pAig, int nPartSize )
{
    Aig_ManPre_t * p;
    p = ABC_ALLOC( Aig_ManPre_t, 1 );
    memset( p, 0, sizeof(Aig_ManPre_t) );
    p->pAig      = pAig;
    p->vMatrix   = Aig_ManSupportsRegisters( pAig );
    p->nRegsMax  = nPartSize;
    p->vParts    = Vec_PtrAlloc(256);
    p->vRegs     = Vec_IntAlloc(256);
    p->vUniques  = Vec_IntAlloc(256);
    p->vFreeVars = Vec_IntAlloc(256);
    p->vPartCost = Vec_FltAlloc(256);
    p->pfUsedRegs = ABC_ALLOC( char, Aig_ManRegNum(p->pAig) );
    memset( p->pfUsedRegs, 0, sizeof(char) * Aig_ManRegNum(p->pAig) );
    p->pfPartVars  = ABC_ALLOC( char, Aig_ManRegNum(p->pAig) );
    return p;
}